

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventplayer.cxx
# Opt level: O0

void __thiscall EventPlayer::init(EventPlayer *this)

{
  EVP_PKEY_CTX *in_RSI;
  
  init((EventPlayer *)
       &this[-1].super_StochasticEventGenerator.super_StochasticVariable.super_StochasticProcess.
        stochDescription.field_2,in_RSI);
  return;
}

Assistant:

void EventPlayer::init()
{
	playerBufferPosition = 0;
	playerCurrentValue = 0;
	playerNextValue = 0;
	stochCurrentValue = 0.0;
	stochNextValue = 0.0;
	StochasticEventGenerator::init();
}